

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O1

int coda_ascbin_cursor_get_array_dim(coda_cursor *cursor,int *num_dims,long *dim)

{
  int iVar1;
  coda_type *pcVar2;
  ulong uVar3;
  int64_t var_dim;
  char s [21];
  long local_50;
  char local_48 [32];
  
  pcVar2 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar2->format) {
    pcVar2 = *(coda_type **)&pcVar2->type_class;
  }
  *num_dims = *(int *)&pcVar2[1].name;
  if (0 < *(int *)&pcVar2[1].name) {
    uVar3 = 0;
    do {
      if ((&pcVar2[1].description)[uVar3] == (char *)0xffffffffffffffff) {
        iVar1 = coda_expression_eval_integer
                          ((coda_expression *)(&pcVar2[2].bit_size)[uVar3],cursor,&local_50);
        if (iVar1 != 0) {
          coda_add_error_message(" for dim[%d] expression",uVar3 & 0xffffffff);
LAB_00188892:
          coda_cursor_add_to_error_message(cursor);
          return -1;
        }
        if (local_50 < 0) {
          coda_str64(local_50,local_48);
          coda_set_error(-300,"product error detected (invalid array size (%s))",local_48);
          goto LAB_00188892;
        }
        dim[uVar3] = local_50;
      }
      else {
        dim[uVar3] = (long)(&pcVar2[1].description)[uVar3];
      }
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)*(int *)&pcVar2[1].name);
  }
  return 0;
}

Assistant:

int coda_ascbin_cursor_get_array_dim(const coda_cursor *cursor, int *num_dims, long dim[])
{
    coda_type_array *array = (coda_type_array *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    int i;

    *num_dims = array->num_dims;
    for (i = 0; i < array->num_dims; i++)
    {
        if (array->dim[i] == -1)
        {
            int64_t var_dim;

            if (coda_expression_eval_integer(array->dim_expr[i], cursor, &var_dim) != 0)
            {
                coda_add_error_message(" for dim[%d] expression", i);
                coda_cursor_add_to_error_message(cursor);
                return -1;
            }
            if (var_dim < 0)
            {
                char s[21];

                coda_str64(var_dim, s);
                coda_set_error(CODA_ERROR_PRODUCT, "product error detected (invalid array size (%s))", s);
                coda_cursor_add_to_error_message(cursor);
                return -1;
            }
            dim[i] = (long)var_dim;
        }
        else
        {
            dim[i] = array->dim[i];
        }
    }

    return 0;
}